

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

Aig_Obj_t * Aig_ObjReal_rec(Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObjR;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj_local;
  
  pAVar2 = Aig_Regular(pObj);
  iVar1 = Aig_ObjIsBuf(pAVar2);
  pObj_local = pObj;
  if (iVar1 != 0) {
    pAVar2 = Aig_ObjChild0(pAVar2);
    pAVar2 = Aig_ObjReal_rec(pAVar2);
    iVar1 = Aig_IsComplement(pObj);
    pObj_local = Aig_NotCond(pAVar2,iVar1);
  }
  return pObj_local;
}

Assistant:

Aig_Obj_t * Aig_ObjReal_rec( Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew, * pObjR = Aig_Regular(pObj);
    if ( !Aig_ObjIsBuf(pObjR) )
        return pObj;
    pObjNew = Aig_ObjReal_rec( Aig_ObjChild0(pObjR) );
    return Aig_NotCond( pObjNew, Aig_IsComplement(pObj) );
}